

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::
     handle_int_type_spec<char,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>>
               (char spec,
               int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_> *handler)

{
  int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_> *handler_local;
  char spec_local;
  
  if (spec == '\0') {
LAB_0017bf75:
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::on_dec(handler);
    return;
  }
  if (spec == 'B') {
LAB_0017bf8b:
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::on_bin(handler);
  }
  else {
    if (spec != 'X') {
      if (spec == 'b') goto LAB_0017bf8b;
      if (spec == 'd') goto LAB_0017bf75;
      if (spec == 'n') {
        basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::on_num(handler);
        return;
      }
      if (spec == 'o') {
        basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::on_oct(handler);
        return;
      }
      if (spec != 'x') {
        basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::on_error(handler);
        return;
      }
    }
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::on_hex(handler);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(Char spec, Handler &&handler) {
  switch (spec) {
  case 0: case 'd':
    handler.on_dec();
    break;
  case 'x': case 'X':
    handler.on_hex();
    break;
  case 'b': case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
    handler.on_num();
    break;
  default:
    handler.on_error();
  }
}